

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O0

void __thiscall Js::ConfigFlagsTable::VerboseDump(ConfigFlagsTable *this)

{
  bool bVar1;
  String *pSVar2;
  char16 *pcVar3;
  Boolean *pBVar4;
  uint *puVar5;
  ConfigFlagsTable *this_local;
  
  bVar1 = IsEnabled(this,ArrayValidateFlag);
  if (bVar1) {
    Output::Print(L"-%s");
    pBVar4 = GetAsBoolean(this,ArrayValidateFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MemOpMissingValueValidateFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MemOpMissingValueValidate");
    pBVar4 = GetAsBoolean(this,MemOpMissingValueValidateFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OOPJITFixupValidateFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"OOPJITFixupValidate");
    pBVar4 = GetAsBoolean(this,OOPJITFixupValidateFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ArenaNoFreeListFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ArenaNoFreeList");
    pBVar4 = GetAsBoolean(this,ArenaNoFreeListFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ArenaNoPageReuseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ArenaNoPageReuse");
    pBVar4 = GetAsBoolean(this,ArenaNoPageReuseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ArenaUseHeapAllocFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ArenaUseHeapAlloc");
    pBVar4 = GetAsBoolean(this,ArenaUseHeapAllocFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ValidateInlineStackFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ValidateInlineStack");
    pBVar4 = GetAsBoolean(this,ValidateInlineStackFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AsmDiffFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AsmDiff");
    pBVar4 = GetAsBoolean(this,AsmDiffFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AsmDumpModeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AsmDumpMode");
    pSVar2 = GetAsString(this,AsmDumpModeFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,AsmDumpModeFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AsmJsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AsmJs");
    pBVar4 = GetAsBoolean(this,AsmJsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AsmJsStopOnErrorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AsmJsStopOnError");
    pBVar4 = GetAsBoolean(this,AsmJsStopOnErrorFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AsmJsEdgeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AsmJsEdge");
    pBVar4 = GetAsBoolean(this,AsmJsEdgeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Wasm");
    pBVar4 = GetAsBoolean(this,WasmFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmI64Flag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmI64");
    pBVar4 = GetAsBoolean(this,WasmI64Flag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmFastArrayFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmFastArray");
    pBVar4 = GetAsBoolean(this,WasmFastArrayFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmSharedArrayVirtualBufferFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmSharedArrayVirtualBuffer");
    pBVar4 = GetAsBoolean(this,WasmSharedArrayVirtualBufferFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmMathExFilterFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmMathExFilter");
    pBVar4 = GetAsBoolean(this,WasmMathExFilterFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmCheckVersionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmCheckVersion");
    pBVar4 = GetAsBoolean(this,WasmCheckVersionFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmAssignModuleIDFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmAssignModuleID");
    pBVar4 = GetAsBoolean(this,WasmAssignModuleIDFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmIgnoreLimitsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmIgnoreLimits");
    pBVar4 = GetAsBoolean(this,WasmIgnoreLimitsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmFoldFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmFold");
    pBVar4 = GetAsBoolean(this,WasmFoldFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmIgnoreResponseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmIgnoreResponse");
    pBVar4 = GetAsBoolean(this,WasmIgnoreResponseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmMaxTableSizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmMaxTableSize");
    puVar5 = (uint *)GetAsNumber(this,WasmMaxTableSizeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmThreadsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmThreads");
    pBVar4 = GetAsBoolean(this,WasmThreadsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmMultiValueFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmMultiValue");
    pBVar4 = GetAsBoolean(this,WasmMultiValueFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmSignExtendsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmSignExtends");
    pBVar4 = GetAsBoolean(this,WasmSignExtendsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmNontrappingFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmNontrapping");
    pBVar4 = GetAsBoolean(this,WasmNontrappingFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmExperimentalFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmExperimental");
    pBVar4 = GetAsBoolean(this,WasmExperimentalFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WasmSimdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WasmSimd");
    pBVar4 = GetAsBoolean(this,WasmSimdFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AssertBreakFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AssertBreak");
    pBVar4 = GetAsBoolean(this,AssertBreakFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AssertPopUpFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AssertPopUp");
    pBVar4 = GetAsBoolean(this,AssertPopUpFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AssertIgnoreFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AssertIgnore");
    pBVar4 = GetAsBoolean(this,AssertIgnoreFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AsyncDebuggingFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AsyncDebugging");
    pBVar4 = GetAsBoolean(this,AsyncDebuggingFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BailOnNoProfileLimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BailOnNoProfileLimit");
    puVar5 = (uint *)GetAsNumber(this,BailOnNoProfileLimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BailOnNoProfileRejitLimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BailOnNoProfileRejitLimit");
    puVar5 = (uint *)GetAsNumber(this,BailOnNoProfileRejitLimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BaselineModeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BaselineMode");
    pBVar4 = GetAsBoolean(this,BaselineModeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpOnCrashFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpOnCrash");
    pSVar2 = GetAsString(this,DumpOnCrashFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DumpOnCrashFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FullMemoryDumpFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"FullMemoryDump");
    pSVar2 = GetAsString(this,FullMemoryDumpFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,FullMemoryDumpFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BailOutFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BailOut");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BailOutAtEveryLineFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BailOutAtEveryLine");
    pBVar4 = GetAsBoolean(this,BailOutAtEveryLineFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BailOutAtEveryByteCodeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BailOutAtEveryByteCode");
    pBVar4 = GetAsBoolean(this,BailOutAtEveryByteCodeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BailOutAtEveryImplicitCallFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BailOutAtEveryImplicitCall");
    pBVar4 = GetAsBoolean(this,BailOutAtEveryImplicitCallFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BailOutByteCodeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BailOutByteCode");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BenchmarkFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Benchmark");
    pBVar4 = GetAsBoolean(this,BenchmarkFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BgJitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BgJit");
    pBVar4 = GetAsBoolean(this,BgJitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BgParseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BgParse");
    pBVar4 = GetAsBoolean(this,BgParseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BgJitDelayFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BgJitDelay");
    puVar5 = (uint *)GetAsNumber(this,BgJitDelayFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BgJitDelayFgBufferFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BgJitDelayFgBuffer");
    puVar5 = (uint *)GetAsNumber(this,BgJitDelayFgBufferFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BgJitPendingFuncCapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BgJitPendingFuncCap");
    puVar5 = (uint *)GetAsNumber(this,BgJitPendingFuncCapFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CreateFunctionProxyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CreateFunctionProxy");
    pBVar4 = GetAsBoolean(this,CreateFunctionProxyFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,HybridFgJitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"HybridFgJit");
    pBVar4 = GetAsBoolean(this,HybridFgJitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,HybridFgJitBgQueueLengthThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"HybridFgJitBgQueueLengthThreshold");
    puVar5 = (uint *)GetAsNumber(this,HybridFgJitBgQueueLengthThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BytecodeHistFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BytecodeHist");
    pBVar4 = GetAsBoolean(this,BytecodeHistFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CurrentSourceInfoFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CurrentSourceInfo");
    pBVar4 = GetAsBoolean(this,CurrentSourceInfoFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CFGLogFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CFGLog");
    pBVar4 = GetAsBoolean(this,CFGLogFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CheckAlignmentFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CheckAlignment");
    pBVar4 = GetAsBoolean(this,CheckAlignmentFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CheckEmitBufferPermissionsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CheckEmitBufferPermissions");
    pBVar4 = GetAsBoolean(this,CheckEmitBufferPermissionsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CheckMemoryLeakFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CheckMemoryLeak");
    pBVar4 = GetAsBoolean(this,CheckMemoryLeakFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpOnLeakFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpOnLeak");
    pSVar2 = GetAsString(this,DumpOnLeakFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DumpOnLeakFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CheckOpHelpersFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CheckOpHelpers");
    pBVar4 = GetAsBoolean(this,CheckOpHelpersFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CloneInlinedPolymorphicCachesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CloneInlinedPolymorphicCaches");
    pBVar4 = GetAsBoolean(this,CloneInlinedPolymorphicCachesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ConcurrentRuntimeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ConcurrentRuntime");
    pBVar4 = GetAsBoolean(this,ConcurrentRuntimeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ConstructorInlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ConstructorInlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,ConstructorInlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ConstructorCallsRequiredToFinalizeCachedTypeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ConstructorCallsRequiredToFinalizeCachedType");
    puVar5 = (uint *)GetAsNumber(this,ConstructorCallsRequiredToFinalizeCachedTypeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PropertyCacheMissPenaltyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PropertyCacheMissPenalty");
    puVar5 = (uint *)GetAsNumber(this,PropertyCacheMissPenaltyFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PropertyCacheMissThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PropertyCacheMissThreshold");
    puVar5 = (uint *)GetAsNumber(this,PropertyCacheMissThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PropertyCacheMissResetFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PropertyCacheMissReset");
    puVar5 = (uint *)GetAsNumber(this,PropertyCacheMissResetFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CrashOnExceptionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CrashOnException");
    pBVar4 = GetAsBoolean(this,CrashOnExceptionFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DebugFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Debug");
    pBVar4 = GetAsBoolean(this,DebugFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DebugBreakFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DebugBreak");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,StatementDebugBreakFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"StatementDebugBreak");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DebugBreakOnPhaseBeginFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DebugBreakOnPhaseBegin");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DebugWindowFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DebugWindow");
    pBVar4 = GetAsBoolean(this,DebugWindowFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ParserStateCacheFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ParserStateCache");
    pBVar4 = GetAsBoolean(this,ParserStateCacheFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CompressParserStateCacheFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CompressParserStateCache");
    pBVar4 = GetAsBoolean(this,CompressParserStateCacheFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DeferTopLevelTillFirstCallFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DeferTopLevelTillFirstCall");
    pBVar4 = GetAsBoolean(this,DeferTopLevelTillFirstCallFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DeferParseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DeferParse");
    puVar5 = (uint *)GetAsNumber(this,DeferParseFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DirectCallTelemetryStatsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DirectCallTelemetryStats");
    pBVar4 = GetAsBoolean(this,DirectCallTelemetryStatsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DisableArrayBTreeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DisableArrayBTree");
    pBVar4 = GetAsBoolean(this,DisableArrayBTreeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DisableRentalThreadingFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DisableRentalThreading");
    pBVar4 = GetAsBoolean(this,DisableRentalThreadingFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DisableVTuneSourceLineInfoFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DisableVTuneSourceLineInfo");
    pBVar4 = GetAsBoolean(this,DisableVTuneSourceLineInfoFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DisplayMemStatsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DisplayMemStats");
    pBVar4 = GetAsBoolean(this,DisplayMemStatsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Dump");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpIRAddressesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpIRAddresses");
    pBVar4 = GetAsBoolean(this,DumpIRAddressesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpLineNoInColorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpLineNoInColor");
    pBVar4 = GetAsBoolean(this,DumpLineNoInColorFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpObjectGraphOnExitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpObjectGraphOnExit");
    pBVar4 = GetAsBoolean(this,DumpObjectGraphOnExitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpObjectGraphOnCollectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpObjectGraphOnCollect");
    pBVar4 = GetAsBoolean(this,DumpObjectGraphOnCollectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpEvalStringOnRemovalFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpEvalStringOnRemoval");
    pBVar4 = GetAsBoolean(this,DumpEvalStringOnRemovalFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpObjectGraphOnEnumFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpObjectGraphOnEnum");
    pBVar4 = GetAsBoolean(this,DumpObjectGraphOnEnumFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DynamicProfileCacheFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DynamicProfileCache");
    pSVar2 = GetAsString(this,DynamicProfileCacheFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DynamicProfileCacheFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DpcFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Dpc");
    pSVar2 = GetAsString(this,DpcFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DpcFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DynamicProfileCacheDirFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DynamicProfileCacheDir");
    pSVar2 = GetAsString(this,DynamicProfileCacheDirFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DynamicProfileCacheDirFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DynamicProfileInputFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DynamicProfileInput");
    pSVar2 = GetAsString(this,DynamicProfileInputFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DynamicProfileInputFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DpiFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Dpi");
    pSVar2 = GetAsString(this,DpiFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DpiFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WininetProfileCacheFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WininetProfileCache");
    pBVar4 = GetAsBoolean(this,WininetProfileCacheFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NoDynamicProfileInMemoryCacheFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NoDynamicProfileInMemoryCache");
    pBVar4 = GetAsBoolean(this,NoDynamicProfileInMemoryCacheFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileBasedSpeculativeJitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileBasedSpeculativeJit");
    pBVar4 = GetAsBoolean(this,ProfileBasedSpeculativeJitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileBasedSpeculationCapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileBasedSpeculationCap");
    puVar5 = (uint *)GetAsNumber(this,ProfileBasedSpeculationCapFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DynamicProfileMutatorDllFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DynamicProfileMutatorDll");
    pSVar2 = GetAsString(this,DynamicProfileMutatorDllFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DynamicProfileMutatorDllFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DynamicProfileMutatorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DynamicProfileMutator");
    pSVar2 = GetAsString(this,DynamicProfileMutatorFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,DynamicProfileMutatorFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ExecuteByteCodeBufferReturnsInvalidByteCodeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ExecuteByteCodeBufferReturnsInvalidByteCode");
    pBVar4 = GetAsBoolean(this,ExecuteByteCodeBufferReturnsInvalidByteCodeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ExpirableCollectionGCCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ExpirableCollectionGCCount");
    puVar5 = (uint *)GetAsNumber(this,ExpirableCollectionGCCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ExpirableCollectionTriggerThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ExpirableCollectionTriggerThreshold");
    puVar5 = (uint *)GetAsNumber(this,ExpirableCollectionTriggerThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SkipSplitOnNoResultFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"SkipSplitOnNoResult");
    pBVar4 = GetAsBoolean(this,SkipSplitOnNoResultFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,Force32BitByteCodeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Force32BitByteCode");
    pBVar4 = GetAsBoolean(this,Force32BitByteCodeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CollectGarbageFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CollectGarbage");
    pBVar4 = GetAsBoolean(this,CollectGarbageFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,IntlFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Intl");
    pBVar4 = GetAsBoolean(this,IntlFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,IntlBuiltInsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"IntlBuiltIns");
    pBVar4 = GetAsBoolean(this,IntlBuiltInsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,IntlPlatformFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"IntlPlatform");
    pBVar4 = GetAsBoolean(this,IntlPlatformFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,JsBuiltInFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"JsBuiltIn");
    pBVar4 = GetAsBoolean(this,JsBuiltInFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,JitReproFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"JitRepro");
    pBVar4 = GetAsBoolean(this,JitReproFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EntryPointInfoRpcDataFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EntryPointInfoRpcData");
    pBVar4 = GetAsBoolean(this,EntryPointInfoRpcDataFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LdChakraLibFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LdChakraLib");
    pBVar4 = GetAsBoolean(this,LdChakraLibFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TestChakraLibFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TestChakraLib");
    pBVar4 = GetAsBoolean(this,TestChakraLibFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6Flag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6");
    pBVar4 = GetAsBoolean(this,ES6Flag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6AllFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6All");
    pBVar4 = GetAsBoolean(this,ES6AllFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6ExperimentalFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Experimental");
    pBVar4 = GetAsBoolean(this,ES6ExperimentalFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES7AsyncAwaitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES7AsyncAwait");
    pBVar4 = GetAsBoolean(this,ES7AsyncAwaitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6DateParseFixFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6DateParseFix");
    pBVar4 = GetAsBoolean(this,ES6DateParseFixFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6FunctionNameFullFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6FunctionNameFull");
    pBVar4 = GetAsBoolean(this,ES6FunctionNameFullFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6GeneratorsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Generators");
    pBVar4 = GetAsBoolean(this,ES6GeneratorsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES7ExponentiationOperatorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES7ExponentiationOperator");
    pBVar4 = GetAsBoolean(this,ES7ExponentiationOperatorFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES7ValuesEntriesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES7ValuesEntries");
    pBVar4 = GetAsBoolean(this,ES7ValuesEntriesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES7TrailingCommaFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES7TrailingComma");
    pBVar4 = GetAsBoolean(this,ES7TrailingCommaFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6IsConcatSpreadableFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6IsConcatSpreadable");
    pBVar4 = GetAsBoolean(this,ES6IsConcatSpreadableFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6MathFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Math");
    pBVar4 = GetAsBoolean(this,ES6MathFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESDynamicImportFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESDynamicImport");
    pBVar4 = GetAsBoolean(this,ESDynamicImportFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6ModuleFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Module");
    pBVar4 = GetAsBoolean(this,ES6ModuleFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6ObjectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Object");
    pBVar4 = GetAsBoolean(this,ES6ObjectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6NumberFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Number");
    pBVar4 = GetAsBoolean(this,ES6NumberFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6ObjectLiteralsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6ObjectLiterals");
    pBVar4 = GetAsBoolean(this,ES6ObjectLiteralsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6ProxyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Proxy");
    pBVar4 = GetAsBoolean(this,ES6ProxyFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6RestFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Rest");
    pBVar4 = GetAsBoolean(this,ES6RestFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6SpreadFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Spread");
    pBVar4 = GetAsBoolean(this,ES6SpreadFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6StringFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6String");
    pBVar4 = GetAsBoolean(this,ES6StringFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6StringPrototypeFixesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6StringPrototypeFixes");
    pBVar4 = GetAsBoolean(this,ES6StringPrototypeFixesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES2018ObjectRestSpreadFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES2018ObjectRestSpread");
    pBVar4 = GetAsBoolean(this,ES2018ObjectRestSpreadFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6PrototypeChainFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6PrototypeChain");
    pBVar4 = GetAsBoolean(this,ES6PrototypeChainFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6ToPrimitiveFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6ToPrimitive");
    pBVar4 = GetAsBoolean(this,ES6ToPrimitiveFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6ToLengthFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6ToLength");
    pBVar4 = GetAsBoolean(this,ES6ToLengthFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6ToStringTagFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6ToStringTag");
    pBVar4 = GetAsBoolean(this,ES6ToStringTagFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6UnicodeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Unicode");
    pBVar4 = GetAsBoolean(this,ES6UnicodeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6UnicodeVerboseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6UnicodeVerbose");
    pBVar4 = GetAsBoolean(this,ES6UnicodeVerboseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6UnscopablesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Unscopables");
    pBVar4 = GetAsBoolean(this,ES6UnscopablesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6RegExStickyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6RegExSticky");
    pBVar4 = GetAsBoolean(this,ES6RegExStickyFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES2018RegExDotAllFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES2018RegExDotAll");
    pBVar4 = GetAsBoolean(this,ES2018RegExDotAllFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESExportNsAsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESExportNsAs");
    pBVar4 = GetAsBoolean(this,ESExportNsAsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES2018AsyncIterationFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES2018AsyncIteration");
    pBVar4 = GetAsBoolean(this,ES2018AsyncIterationFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESTopLevelAwaitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESTopLevelAwait");
    pBVar4 = GetAsBoolean(this,ESTopLevelAwaitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6RegExPrototypePropertiesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6RegExPrototypeProperties");
    pBVar4 = GetAsBoolean(this,ES6RegExPrototypePropertiesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6RegExSymbolsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6RegExSymbols");
    pBVar4 = GetAsBoolean(this,ES6RegExSymbolsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ES6VerboseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ES6Verbose");
    pBVar4 = GetAsBoolean(this,ES6VerboseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESObjectGetOwnPropertyDescriptorsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESObjectGetOwnPropertyDescriptors");
    pBVar4 = GetAsBoolean(this,ESObjectGetOwnPropertyDescriptorsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESSharedArrayBufferFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESSharedArrayBuffer");
    pBVar4 = GetAsBoolean(this,ESSharedArrayBufferFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESBigIntFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESBigInt");
    pBVar4 = GetAsBoolean(this,ESBigIntFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESNumericSeparatorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESNumericSeparator");
    pBVar4 = GetAsBoolean(this,ESNumericSeparatorFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESNullishCoalescingOperatorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESNullishCoalescingOperator");
    pBVar4 = GetAsBoolean(this,ESNullishCoalescingOperatorFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESHashbangFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESHashbang");
    pBVar4 = GetAsBoolean(this,ESHashbangFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESSymbolDescriptionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESSymbolDescription");
    pBVar4 = GetAsBoolean(this,ESSymbolDescriptionFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESArrayFindFromLastFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESArrayFindFromLast");
    pBVar4 = GetAsBoolean(this,ESArrayFindFromLastFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESPromiseAnyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESPromiseAny");
    pBVar4 = GetAsBoolean(this,ESPromiseAnyFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESImportMetaFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESImportMeta");
    pBVar4 = GetAsBoolean(this,ESImportMetaFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ESGlobalThisFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ESGlobalThis");
    pBVar4 = GetAsBoolean(this,ESGlobalThisFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,JitES6GeneratorsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"JitES6Generators");
    pBVar4 = GetAsBoolean(this,JitES6GeneratorsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FastLineColumnCalculationFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"FastLineColumnCalculation");
    pBVar4 = GetAsBoolean(this,FastLineColumnCalculationFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FilenameFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Filename");
    pSVar2 = GetAsString(this,FilenameFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,FilenameFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FreeRejittedCodeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"FreeRejittedCode");
    pBVar4 = GetAsBoolean(this,FreeRejittedCodeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceGuardPagesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceGuardPages");
    pBVar4 = GetAsBoolean(this,ForceGuardPagesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PrintGuardPageBoundsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PrintGuardPageBounds");
    pBVar4 = GetAsBoolean(this,PrintGuardPageBoundsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceLegacyEngineFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceLegacyEngine");
    pBVar4 = GetAsBoolean(this,ForceLegacyEngineFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Force");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,StressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Stress");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceArrayBTreeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceArrayBTree");
    pBVar4 = GetAsBoolean(this,ForceArrayBTreeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,StrongArraySortFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"StrongArraySort");
    pBVar4 = GetAsBoolean(this,StrongArraySortFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceCleanPropertyOnCollectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceCleanPropertyOnCollect");
    pBVar4 = GetAsBoolean(this,ForceCleanPropertyOnCollectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceCleanCacheOnCollectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceCleanCacheOnCollect");
    pBVar4 = GetAsBoolean(this,ForceCleanCacheOnCollectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceGCAfterJSONParseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceGCAfterJSONParse");
    pBVar4 = GetAsBoolean(this,ForceGCAfterJSONParseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceDecommitOnCollectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceDecommitOnCollect");
    pBVar4 = GetAsBoolean(this,ForceDecommitOnCollectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceDeferParseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceDeferParse");
    pBVar4 = GetAsBoolean(this,ForceDeferParseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceDiagnosticsModeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceDiagnosticsMode");
    pBVar4 = GetAsBoolean(this,ForceDiagnosticsModeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceGetWriteWatchOOMFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceGetWriteWatchOOM");
    pBVar4 = GetAsBoolean(this,ForceGetWriteWatchOOMFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForcePostLowerGlobOptInstrStringFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForcePostLowerGlobOptInstrString");
    pBVar4 = GetAsBoolean(this,ForcePostLowerGlobOptInstrStringFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceSplitScopeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceSplitScope");
    pBVar4 = GetAsBoolean(this,ForceSplitScopeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnumerateSpecialPropertiesInDebuggerFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnumerateSpecialPropertiesInDebugger");
    pBVar4 = GetAsBoolean(this,EnumerateSpecialPropertiesInDebuggerFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnableContinueAfterExceptionWrappersForHelpersFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnableContinueAfterExceptionWrappersForHelpers");
    pBVar4 = GetAsBoolean(this,EnableContinueAfterExceptionWrappersForHelpersFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnableContinueAfterExceptionWrappersForBuiltInsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnableContinueAfterExceptionWrappersForBuiltIns");
    pBVar4 = GetAsBoolean(this,EnableContinueAfterExceptionWrappersForBuiltInsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnableFunctionSourceReportForHeapEnumFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnableFunctionSourceReportForHeapEnum");
    pBVar4 = GetAsBoolean(this,EnableFunctionSourceReportForHeapEnumFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceFragmentAddressSpaceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceFragmentAddressSpace");
    puVar5 = (uint *)GetAsNumber(this,ForceFragmentAddressSpaceFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceOOMOnEBCommitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceOOMOnEBCommit");
    puVar5 = (uint *)GetAsNumber(this,ForceOOMOnEBCommitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceDynamicProfileFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceDynamicProfile");
    pBVar4 = GetAsBoolean(this,ForceDynamicProfileFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceES5ArrayFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceES5Array");
    pBVar4 = GetAsBoolean(this,ForceES5ArrayFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceAsmJsLinkFailFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceAsmJsLinkFail");
    pBVar4 = GetAsBoolean(this,ForceAsmJsLinkFailFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceExpireOnNonCacheCollectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceExpireOnNonCacheCollect");
    pBVar4 = GetAsBoolean(this,ForceExpireOnNonCacheCollectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceFastPathFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceFastPath");
    pBVar4 = GetAsBoolean(this,ForceFastPathFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceFloatPrefFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceFloatPref");
    pBVar4 = GetAsBoolean(this,ForceFloatPrefFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceJITLoopBodyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceJITLoopBody");
    pBVar4 = GetAsBoolean(this,ForceJITLoopBodyFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceStaticInterpreterThunkFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceStaticInterpreterThunk");
    pBVar4 = GetAsBoolean(this,ForceStaticInterpreterThunkFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpCommentsFromReferencedFilesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpCommentsFromReferencedFiles");
    pBVar4 = GetAsBoolean(this,DumpCommentsFromReferencedFilesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DelayFullJITSmallFuncFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DelayFullJITSmallFunc");
    puVar5 = (uint *)GetAsNumber(this,DelayFullJITSmallFuncFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnableFatalErrorOnOOMFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnableFatalErrorOnOOM");
    pBVar4 = GetAsBoolean(this,EnableFatalErrorOnOOMFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DeferLoadingAvailableSourceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DeferLoadingAvailableSource");
    pBVar4 = GetAsBoolean(this,DeferLoadingAvailableSourceFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceNativeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceNative");
    pBVar4 = GetAsBoolean(this,ForceNativeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceSerializedFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceSerialized");
    pBVar4 = GetAsBoolean(this,ForceSerializedFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceSerializedBytecodeMajorVersionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceSerializedBytecodeMajorVersion");
    puVar5 = (uint *)GetAsNumber(this,ForceSerializedBytecodeMajorVersionFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceSerializedBytecodeVersionSchemaFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceSerializedBytecodeVersionSchema");
    puVar5 = (uint *)GetAsNumber(this,ForceSerializedBytecodeVersionSchemaFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceStrictModeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceStrictMode");
    pBVar4 = GetAsBoolean(this,ForceStrictModeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceUndoDeferFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceUndoDefer");
    pBVar4 = GetAsBoolean(this,ForceUndoDeferFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceBlockingConcurrentCollectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceBlockingConcurrentCollect");
    pBVar4 = GetAsBoolean(this,ForceBlockingConcurrentCollectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FreTestDiagModeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"FreTestDiagMode");
    pBVar4 = GetAsBoolean(this,FreTestDiagModeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ByteCodeBranchLimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ByteCodeBranchLimit");
    puVar5 = (uint *)GetAsNumber(this,ByteCodeBranchLimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MediumByteCodeLayoutFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MediumByteCodeLayout");
    pBVar4 = GetAsBoolean(this,MediumByteCodeLayoutFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LargeByteCodeLayoutFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LargeByteCodeLayout");
    pBVar4 = GetAsBoolean(this,LargeByteCodeLayoutFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InduceCodeGenFailureFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InduceCodeGenFailure");
    puVar5 = (uint *)GetAsNumber(this,InduceCodeGenFailureFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InduceCodeGenFailureSeedFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InduceCodeGenFailureSeed");
    puVar5 = (uint *)GetAsNumber(this,InduceCodeGenFailureSeedFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InjectPartiallyInitializedInterpreterFrameErrorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InjectPartiallyInitializedInterpreterFrameError");
    puVar5 = (uint *)GetAsNumber(this,InjectPartiallyInitializedInterpreterFrameErrorFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InjectPartiallyInitializedInterpreterFrameErrorTypeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InjectPartiallyInitializedInterpreterFrameErrorType");
    puVar5 = (uint *)GetAsNumber(this,InjectPartiallyInitializedInterpreterFrameErrorTypeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,GenerateByteCodeBufferReturnsCantGenerateFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"GenerateByteCodeBufferReturnsCantGenerate");
    pBVar4 = GetAsBoolean(this,GenerateByteCodeBufferReturnsCantGenerateFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,GoptCleanupThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"GoptCleanupThreshold");
    puVar5 = (uint *)GetAsNumber(this,GoptCleanupThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AsmGoptCleanupThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AsmGoptCleanupThreshold");
    puVar5 = (uint *)GetAsNumber(this,AsmGoptCleanupThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,HighPrecisionDateFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"HighPrecisionDate");
    pBVar4 = GetAsBoolean(this,HighPrecisionDateFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InlineCountMaxFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InlineCountMax");
    puVar5 = (uint *)GetAsNumber(this,InlineCountMaxFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InlineCountMaxInLoopBodiesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InlineCountMaxInLoopBodies");
    puVar5 = (uint *)GetAsNumber(this,InlineCountMaxInLoopBodiesFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,icminlbFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"icminlb");
    puVar5 = (uint *)GetAsNumber(this,icminlbFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InlineInLoopBodyScaleDownFactorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InlineInLoopBodyScaleDownFactor");
    puVar5 = (uint *)GetAsNumber(this,InlineInLoopBodyScaleDownFactorFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,iilbsdfFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"iilbsdf");
    puVar5 = (uint *)GetAsNumber(this,iilbsdfFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,InlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AggressiveInlineCountMaxFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AggressiveInlineCountMax");
    puVar5 = (uint *)GetAsNumber(this,AggressiveInlineCountMaxFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AggressiveInlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AggressiveInlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,AggressiveInlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InlineThresholdAdjustCountInLargeFunctionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InlineThresholdAdjustCountInLargeFunction");
    puVar5 = (uint *)GetAsNumber(this,InlineThresholdAdjustCountInLargeFunctionFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InlineThresholdAdjustCountInMediumSizedFunctionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InlineThresholdAdjustCountInMediumSizedFunction");
    puVar5 = (uint *)GetAsNumber(this,InlineThresholdAdjustCountInMediumSizedFunctionFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InlineThresholdAdjustCountInSmallFunctionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InlineThresholdAdjustCountInSmallFunction");
    puVar5 = (uint *)GetAsNumber(this,InlineThresholdAdjustCountInSmallFunctionFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AsmJsInlineAdjustFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AsmJsInlineAdjust");
    puVar5 = (uint *)GetAsNumber(this,AsmJsInlineAdjustFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InterpretFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Interpret");
    pSVar2 = GetAsString(this,InterpretFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,InterpretFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InstrumentFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Instrument");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,JitQueueThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"JitQueueThreshold");
    puVar5 = (uint *)GetAsNumber(this,JitQueueThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LeakReportFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LeakReport");
    pSVar2 = GetAsString(this,LeakReportFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,LeakReportFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LoopInlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LoopInlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,LoopInlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LeafInlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LeafInlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,LeafInlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ConstantArgumentInlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ConstantArgumentInlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,ConstantArgumentInlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecursiveInlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecursiveInlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,RecursiveInlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecursiveInlineDepthMaxFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecursiveInlineDepthMax");
    puVar5 = (uint *)GetAsNumber(this,RecursiveInlineDepthMaxFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecursiveInlineDepthMinFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecursiveInlineDepthMin");
    puVar5 = (uint *)GetAsNumber(this,RecursiveInlineDepthMinFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RedeferralCapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RedeferralCap");
    puVar5 = (uint *)GetAsNumber(this,RedeferralCapFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LoopFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Loop");
    puVar5 = (uint *)GetAsNumber(this,LoopFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LoopInterpretCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LoopInterpretCount");
    puVar5 = (uint *)GetAsNumber(this,LoopInterpretCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,licFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"lic");
    puVar5 = (uint *)GetAsNumber(this,licFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LoopProfileIterationsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LoopProfileIterations");
    puVar5 = (uint *)GetAsNumber(this,LoopProfileIterationsFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OutsideLoopInlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"OutsideLoopInlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,OutsideLoopInlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxFuncInlineDepthFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxFuncInlineDepth");
    puVar5 = (uint *)GetAsNumber(this,MaxFuncInlineDepthFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxNumberOfInlineesWithLoopFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxNumberOfInlineesWithLoop");
    puVar5 = (uint *)GetAsNumber(this,MaxNumberOfInlineesWithLoopFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MemspectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Memspect");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PolymorphicInlineThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PolymorphicInlineThreshold");
    puVar5 = (uint *)GetAsNumber(this,PolymorphicInlineThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PrimeRecyclerFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PrimeRecycler");
    pBVar4 = GetAsBoolean(this,PrimeRecyclerFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PrivateHeapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PrivateHeap");
    pBVar4 = GetAsBoolean(this,PrivateHeapFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceEngineRefcountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceEngineRefcount");
    pBVar4 = GetAsBoolean(this,TraceEngineRefcountFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LeakStackTraceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LeakStackTrace");
    pBVar4 = GetAsBoolean(this,LeakStackTraceFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceMemoryLeakFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceMemoryLeak");
    pBVar4 = GetAsBoolean(this,ForceMemoryLeakFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpAfterFinalGCFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpAfterFinalGC");
    pBVar4 = GetAsBoolean(this,DumpAfterFinalGCFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceOldDateAPIFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceOldDateAPI");
    pBVar4 = GetAsBoolean(this,ForceOldDateAPIFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,JitLoopBodyHotLoopThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"JitLoopBodyHotLoopThreshold");
    puVar5 = (uint *)GetAsNumber(this,JitLoopBodyHotLoopThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LoopBodySizeThresholdToDisableOptsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LoopBodySizeThresholdToDisableOpts");
    puVar5 = (uint *)GetAsNumber(this,LoopBodySizeThresholdToDisableOptsFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxJitThreadCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxJitThreadCount");
    puVar5 = (uint *)GetAsNumber(this,MaxJitThreadCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceMaxJitThreadCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceMaxJitThreadCount");
    pBVar4 = GetAsBoolean(this,ForceMaxJitThreadCountFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MitigateSpectreFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MitigateSpectre");
    pBVar4 = GetAsBoolean(this,MitigateSpectreFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AddMaskingBlocksFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AddMaskingBlocks");
    pBVar4 = GetAsBoolean(this,AddMaskingBlocksFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonVarArrayLoadFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonVarArrayLoad");
    pBVar4 = GetAsBoolean(this,PoisonVarArrayLoadFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonIntArrayLoadFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonIntArrayLoad");
    pBVar4 = GetAsBoolean(this,PoisonIntArrayLoadFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonFloatArrayLoadFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonFloatArrayLoad");
    pBVar4 = GetAsBoolean(this,PoisonFloatArrayLoadFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonTypedArrayLoadFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonTypedArrayLoad");
    pBVar4 = GetAsBoolean(this,PoisonTypedArrayLoadFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonStringLoadFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonStringLoad");
    pBVar4 = GetAsBoolean(this,PoisonStringLoadFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonObjectsForLoadsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonObjectsForLoads");
    pBVar4 = GetAsBoolean(this,PoisonObjectsForLoadsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonVarArrayStoreFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonVarArrayStore");
    pBVar4 = GetAsBoolean(this,PoisonVarArrayStoreFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonIntArrayStoreFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonIntArrayStore");
    pBVar4 = GetAsBoolean(this,PoisonIntArrayStoreFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonFloatArrayStoreFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonFloatArrayStore");
    pBVar4 = GetAsBoolean(this,PoisonFloatArrayStoreFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonTypedArrayStoreFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonTypedArrayStore");
    pBVar4 = GetAsBoolean(this,PoisonTypedArrayStoreFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonStringStoreFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonStringStore");
    pBVar4 = GetAsBoolean(this,PoisonStringStoreFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PoisonObjectsForStoresFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PoisonObjectsForStores");
    pBVar4 = GetAsBoolean(this,PoisonObjectsForStoresFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinInterpretCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinInterpretCount");
    puVar5 = (uint *)GetAsNumber(this,MinInterpretCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinSimpleJitRunCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinSimpleJitRunCount");
    puVar5 = (uint *)GetAsNumber(this,MinSimpleJitRunCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxInterpretCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxInterpretCount");
    puVar5 = (uint *)GetAsNumber(this,MaxInterpretCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MicFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Mic");
    puVar5 = (uint *)GetAsNumber(this,MicFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxSimpleJitRunCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxSimpleJitRunCount");
    puVar5 = (uint *)GetAsNumber(this,MaxSimpleJitRunCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MsjrcFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Msjrc");
    puVar5 = (uint *)GetAsNumber(this,MsjrcFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinMemOpCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinMemOpCount");
    puVar5 = (uint *)GetAsNumber(this,MinMemOpCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MmocFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Mmoc");
    puVar5 = (uint *)GetAsNumber(this,MmocFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxCopyOnAccessArrayLengthFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxCopyOnAccessArrayLength");
    puVar5 = (uint *)GetAsNumber(this,MaxCopyOnAccessArrayLengthFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinCopyOnAccessArrayLengthFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinCopyOnAccessArrayLength");
    puVar5 = (uint *)GetAsNumber(this,MinCopyOnAccessArrayLengthFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CopyOnAccessArraySegmentCacheSizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CopyOnAccessArraySegmentCacheSize");
    puVar5 = (uint *)GetAsNumber(this,CopyOnAccessArraySegmentCacheSizeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinTemplatizedJitRunCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinTemplatizedJitRunCount");
    puVar5 = (uint *)GetAsNumber(this,MinTemplatizedJitRunCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinAsmJsInterpreterRunCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinAsmJsInterpreterRunCount");
    puVar5 = (uint *)GetAsNumber(this,MinAsmJsInterpreterRunCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinTemplatizedJitLoopRunCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinTemplatizedJitLoopRunCount");
    puVar5 = (uint *)GetAsNumber(this,MinTemplatizedJitLoopRunCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxTemplatizedJitRunCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxTemplatizedJitRunCount");
    puVar5 = (uint *)GetAsNumber(this,MaxTemplatizedJitRunCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MtjrcFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Mtjrc");
    puVar5 = (uint *)GetAsNumber(this,MtjrcFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxAsmJsInterpreterRunCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxAsmJsInterpreterRunCount");
    puVar5 = (uint *)GetAsNumber(this,MaxAsmJsInterpreterRunCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaicFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Maic");
    puVar5 = (uint *)GetAsNumber(this,MaicFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AutoProfilingInterpreter0LimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AutoProfilingInterpreter0Limit");
    puVar5 = (uint *)GetAsNumber(this,AutoProfilingInterpreter0LimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfilingInterpreter0LimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfilingInterpreter0Limit");
    puVar5 = (uint *)GetAsNumber(this,ProfilingInterpreter0LimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AutoProfilingInterpreter1LimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AutoProfilingInterpreter1Limit");
    puVar5 = (uint *)GetAsNumber(this,AutoProfilingInterpreter1LimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SimpleJitLimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"SimpleJitLimit");
    puVar5 = (uint *)GetAsNumber(this,SimpleJitLimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfilingInterpreter1LimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfilingInterpreter1Limit");
    puVar5 = (uint *)GetAsNumber(this,ProfilingInterpreter1LimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ExecutionModeLimitsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ExecutionModeLimits");
    pSVar2 = GetAsString(this,ExecutionModeLimitsFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,ExecutionModeLimitsFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EmlFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Eml");
    pSVar2 = GetAsString(this,EmlFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,EmlFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnforceExecutionModeLimitsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnforceExecutionModeLimits");
    pBVar4 = GetAsBoolean(this,EnforceExecutionModeLimitsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EemlFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Eeml");
    pBVar4 = GetAsBoolean(this,EemlFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SimpleJitAfterFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"SimpleJitAfter");
    puVar5 = (uint *)GetAsNumber(this,SimpleJitAfterFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SjaFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Sja");
    puVar5 = (uint *)GetAsNumber(this,SjaFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FullJitAfterFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"FullJitAfter");
    puVar5 = (uint *)GetAsNumber(this,FullJitAfterFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FjaFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Fja");
    puVar5 = (uint *)GetAsNumber(this,FjaFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NewSimpleJitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NewSimpleJit");
    pBVar4 = GetAsBoolean(this,NewSimpleJitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxLinearIntCaseCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxLinearIntCaseCount");
    puVar5 = (uint *)GetAsNumber(this,MaxLinearIntCaseCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxSingleCharStrJumpTableSizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxSingleCharStrJumpTableSize");
    puVar5 = (uint *)GetAsNumber(this,MaxSingleCharStrJumpTableSizeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxSingleCharStrJumpTableRatioFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxSingleCharStrJumpTableRatio");
    puVar5 = (uint *)GetAsNumber(this,MaxSingleCharStrJumpTableRatioFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinSwitchJumpTableSizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinSwitchJumpTableSize");
    puVar5 = (uint *)GetAsNumber(this,MinSwitchJumpTableSizeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxLinearStringCaseCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxLinearStringCaseCount");
    puVar5 = (uint *)GetAsNumber(this,MaxLinearStringCaseCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinDeferredFuncTokenCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinDeferredFuncTokenCount");
    puVar5 = (uint *)GetAsNumber(this,MinDeferredFuncTokenCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SkipFuncCountForBailOnNoProfileFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"SkipFuncCountForBailOnNoProfile");
    puVar5 = (uint *)GetAsNumber(this,SkipFuncCountForBailOnNoProfileFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxJITFunctionBytecodeByteLengthFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxJITFunctionBytecodeByteLength");
    puVar5 = (uint *)GetAsNumber(this,MaxJITFunctionBytecodeByteLengthFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxJITFunctionBytecodeCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxJITFunctionBytecodeCount");
    puVar5 = (uint *)GetAsNumber(this,MaxJITFunctionBytecodeCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxLoopsPerFunctionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxLoopsPerFunction");
    puVar5 = (uint *)GetAsNumber(this,MaxLoopsPerFunctionFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FuncObjectInlineCacheThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"FuncObjectInlineCacheThreshold");
    puVar5 = (uint *)GetAsNumber(this,FuncObjectInlineCacheThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NoDeferParseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NoDeferParse");
    pBVar4 = GetAsBoolean(this,NoDeferParseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NoLogoFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NoLogo");
    pBVar4 = GetAsBoolean(this,NoLogoFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OOPJITMissingOptsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"OOPJITMissingOpts");
    pBVar4 = GetAsBoolean(this,OOPJITMissingOptsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CrashOnOOPJITFailureFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CrashOnOOPJITFailure");
    pBVar4 = GetAsBoolean(this,CrashOnOOPJITFailureFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OOPCFGRegistrationFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"OOPCFGRegistration");
    pBVar4 = GetAsBoolean(this,OOPCFGRegistrationFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceJITCFGCheckFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceJITCFGCheck");
    pBVar4 = GetAsBoolean(this,ForceJITCFGCheckFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,UseJITTrampolineFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"UseJITTrampoline");
    pBVar4 = GetAsBoolean(this,UseJITTrampolineFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NoNativeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NoNative");
    pBVar4 = GetAsBoolean(this,NoNativeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NopFrequencyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NopFrequency");
    puVar5 = (uint *)GetAsNumber(this,NopFrequencyFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NoStrictModeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NoStrictMode");
    pBVar4 = GetAsBoolean(this,NoStrictModeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NormalizeStatsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NormalizeStats");
    pBVar4 = GetAsBoolean(this,NormalizeStatsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OffFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Off");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OffProfiledByteCodeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"OffProfiledByteCode");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OnFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"On");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OutputFileFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"OutputFile");
    pSVar2 = GetAsString(this,OutputFileFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,OutputFileFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OutputFileOpenModeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"OutputFileOpenMode");
    pSVar2 = GetAsString(this,OutputFileOpenModeFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,OutputFileOpenModeFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InMemoryTraceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InMemoryTrace");
    pBVar4 = GetAsBoolean(this,InMemoryTraceFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InMemoryTraceBufferSizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InMemoryTraceBufferSize");
    puVar5 = (uint *)GetAsNumber(this,InMemoryTraceBufferSizeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceWithStackFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceWithStack");
    pBVar4 = GetAsBoolean(this,TraceWithStackFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PrintRunTimeDataCollectionTraceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PrintRunTimeDataCollectionTrace");
    pBVar4 = GetAsBoolean(this,PrintRunTimeDataCollectionTraceFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PrejitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Prejit");
    pBVar4 = GetAsBoolean(this,PrejitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PrintSrcInDumpFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PrintSrcInDump");
    pBVar4 = GetAsBoolean(this,PrintSrcInDumpFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileDictionaryFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileDictionary");
    puVar5 = (uint *)GetAsNumber(this,ProfileDictionaryFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Profile");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileThreshold");
    puVar5 = (uint *)GetAsNumber(this,ProfileThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileObjectLiteralFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileObjectLiteral");
    pBVar4 = GetAsBoolean(this,ProfileObjectLiteralFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileMemoryFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileMemory");
    pSVar2 = GetAsString(this,ProfileMemoryFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,ProfileMemoryFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileStringsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileStrings");
    pBVar4 = GetAsBoolean(this,ProfileStringsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileTypesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileTypes");
    pBVar4 = GetAsBoolean(this,ProfileTypesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileEvalMapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileEvalMap");
    pBVar4 = GetAsBoolean(this,ProfileEvalMapFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ProfileBailOutRecordMemoryFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ProfileBailOutRecordMemory");
    pBVar4 = GetAsBoolean(this,ProfileBailOutRecordMemoryFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ValidateIntRangesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ValidateIntRanges");
    pBVar4 = GetAsBoolean(this,ValidateIntRangesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RejitMaxBailOutCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RejitMaxBailOutCount");
    puVar5 = (uint *)GetAsNumber(this,RejitMaxBailOutCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,CallsToBailoutsRatioForRejitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"CallsToBailoutsRatioForRejit");
    puVar5 = (uint *)GetAsNumber(this,CallsToBailoutsRatioForRejitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LoopIterationsToBailoutsRatioForRejitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LoopIterationsToBailoutsRatioForRejit");
    puVar5 = (uint *)GetAsNumber(this,LoopIterationsToBailoutsRatioForRejitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinBailOutsBeforeRejitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinBailOutsBeforeRejit");
    puVar5 = (uint *)GetAsNumber(this,MinBailOutsBeforeRejitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinBailOutsBeforeRejitForLoopsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinBailOutsBeforeRejitForLoops");
    puVar5 = (uint *)GetAsNumber(this,MinBailOutsBeforeRejitForLoopsFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LibraryStackFrameFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LibraryStackFrame");
    pBVar4 = GetAsBoolean(this,LibraryStackFrameFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LibraryStackFrameDebuggerFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LibraryStackFrameDebugger");
    pBVar4 = GetAsBoolean(this,LibraryStackFrameDebuggerFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerStress");
    pBVar4 = GetAsBoolean(this,RecyclerStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerBackgroundStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerBackgroundStress");
    pBVar4 = GetAsBoolean(this,RecyclerBackgroundStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerConcurrentStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerConcurrentStress");
    pBVar4 = GetAsBoolean(this,RecyclerConcurrentStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerConcurrentRepeatStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerConcurrentRepeatStress");
    pBVar4 = GetAsBoolean(this,RecyclerConcurrentRepeatStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerPartialStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerPartialStress");
    pBVar4 = GetAsBoolean(this,RecyclerPartialStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerTrackStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerTrackStress");
    pBVar4 = GetAsBoolean(this,RecyclerTrackStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerInduceFalsePositivesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerInduceFalsePositives");
    pBVar4 = GetAsBoolean(this,RecyclerInduceFalsePositivesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerForceMarkInteriorFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerForceMarkInterior");
    pBVar4 = GetAsBoolean(this,RecyclerForceMarkInteriorFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerPriorityBoostTimeoutFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerPriorityBoostTimeout");
    puVar5 = (uint *)GetAsNumber(this,RecyclerPriorityBoostTimeoutFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerThreadCollectTimeoutFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerThreadCollectTimeout");
    puVar5 = (uint *)GetAsNumber(this,RecyclerThreadCollectTimeoutFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnableConcurrentSweepAllocFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnableConcurrentSweepAlloc");
    pBVar4 = GetAsBoolean(this,EnableConcurrentSweepAllocFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ecsaFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ecsa");
    pBVar4 = GetAsBoolean(this,ecsaFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PageHeapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PageHeap");
    puVar5 = (uint *)GetAsNumber(this,PageHeapFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PageHeapAllocStackFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PageHeapAllocStack");
    pBVar4 = GetAsBoolean(this,PageHeapAllocStackFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PageHeapFreeStackFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PageHeapFreeStack");
    pBVar4 = GetAsBoolean(this,PageHeapFreeStackFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PageHeapBucketNumberFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PageHeapBucketNumber");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PageHeapBlockTypeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PageHeapBlockType");
    puVar5 = (uint *)GetAsNumber(this,PageHeapBlockTypeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PageHeapDecommitGuardPageFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PageHeapDecommitGuardPage");
    pBVar4 = GetAsBoolean(this,PageHeapDecommitGuardPageFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerNoPageReuseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerNoPageReuse");
    pBVar4 = GetAsBoolean(this,RecyclerNoPageReuseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerVerifyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerVerify");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerVerifyPadSizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerVerifyPadSize");
    puVar5 = (uint *)GetAsNumber(this,RecyclerVerifyPadSizeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerTestFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerTest");
    pBVar4 = GetAsBoolean(this,RecyclerTestFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerProtectPagesOnRescanFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerProtectPagesOnRescan");
    pBVar4 = GetAsBoolean(this,RecyclerProtectPagesOnRescanFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RecyclerVerifyMarkFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RecyclerVerifyMark");
    pBVar4 = GetAsBoolean(this,RecyclerVerifyMarkFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LowMemoryCapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LowMemoryCap");
    puVar5 = (uint *)GetAsNumber(this,LowMemoryCapFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NewPagesCapDuringBGSweepingFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NewPagesCapDuringBGSweeping");
    puVar5 = (uint *)GetAsNumber(this,NewPagesCapDuringBGSweepingFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,AllocPolicyLimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"AllocPolicyLimit");
    puVar5 = (uint *)GetAsNumber(this,AllocPolicyLimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RuntimeDataOutputFileFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RuntimeDataOutputFile");
    pSVar2 = GetAsString(this,RuntimeDataOutputFileFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,RuntimeDataOutputFileFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SpeculationCapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"SpeculationCap");
    puVar5 = (uint *)GetAsNumber(this,SpeculationCapFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,StatsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Stats");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SwallowExceptionsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"SwallowExceptions");
    pBVar4 = GetAsBoolean(this,SwallowExceptionsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PrintSystemExceptionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PrintSystemException");
    pBVar4 = GetAsBoolean(this,PrintSystemExceptionFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SwitchOptHolesThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"SwitchOptHolesThreshold");
    puVar5 = (uint *)GetAsNumber(this,SwitchOptHolesThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TempMinFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TempMin");
    puVar5 = (uint *)GetAsNumber(this,TempMinFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TempMaxFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TempMax");
    puVar5 = (uint *)GetAsNumber(this,TempMaxFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Trace");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,LoopAlignNopLimitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"LoopAlignNopLimit");
    puVar5 = (uint *)GetAsNumber(this,LoopAlignNopLimitFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceMemoryFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceMemory");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceMetaDataParsingFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceMetaDataParsing");
    puVar5 = (uint *)GetAsNumber(this,TraceMetaDataParsingFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceWin8AllocationsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceWin8Allocations");
    pBVar4 = GetAsBoolean(this,TraceWin8AllocationsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceWin8DeallocationsImmediateFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceWin8DeallocationsImmediate");
    pBVar4 = GetAsBoolean(this,TraceWin8DeallocationsImmediateFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PrintWin8StatsDetailedFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PrintWin8StatsDetailed");
    pBVar4 = GetAsBoolean(this,PrintWin8StatsDetailedFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceProtectPagesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceProtectPages");
    pBVar4 = GetAsBoolean(this,TraceProtectPagesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceAsyncDebugCallsFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceAsyncDebugCalls");
    pBVar4 = GetAsBoolean(this,TraceAsyncDebugCallsFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TrackDispatchFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TrackDispatch");
    pBVar4 = GetAsBoolean(this,TrackDispatchFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,VerboseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Verbose");
    pBVar4 = GetAsBoolean(this,VerboseFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,UseFullNameFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"UseFullName");
    pBVar4 = GetAsBoolean(this,UseFullNameFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,Utf8Flag);
  if (bVar1) {
    Output::Print(L"-%s",L"Utf8");
    pBVar4 = GetAsBoolean(this,Utf8Flag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,VersionFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Version");
    puVar5 = (uint *)GetAsNumber(this,VersionFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WERExceptionSupportFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WERExceptionSupport");
    pBVar4 = GetAsBoolean(this,WERExceptionSupportFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ExtendedErrorStackForTestHostFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ExtendedErrorStackForTestHost");
    pBVar4 = GetAsBoolean(this,ExtendedErrorStackForTestHostFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,errorStackTraceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"errorStackTrace");
    pBVar4 = GetAsBoolean(this,errorStackTraceFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DoHeapEnumOnEngineShutdownFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DoHeapEnumOnEngineShutdown");
    pBVar4 = GetAsBoolean(this,DoHeapEnumOnEngineShutdownFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RegexTracingFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RegexTracing");
    pBVar4 = GetAsBoolean(this,RegexTracingFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RegexProfileFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RegexProfile");
    pBVar4 = GetAsBoolean(this,RegexProfileFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RegexDebugFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RegexDebug");
    pBVar4 = GetAsBoolean(this,RegexDebugFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RegexDebugASTFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RegexDebugAST");
    pBVar4 = GetAsBoolean(this,RegexDebugASTFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RegexDebugAnnotatedASTFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RegexDebugAnnotatedAST");
    pBVar4 = GetAsBoolean(this,RegexDebugAnnotatedASTFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RegexBytecodeDebugFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RegexBytecodeDebug");
    pBVar4 = GetAsBoolean(this,RegexBytecodeDebugFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RegexOptimizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RegexOptimize");
    pBVar4 = GetAsBoolean(this,RegexOptimizeFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DynamicRegexMruListSizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DynamicRegexMruListSize");
    puVar5 = (uint *)GetAsNumber(this,DynamicRegexMruListSizeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,OptimizeForManyInstancesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"OptimizeForManyInstances");
    pBVar4 = GetAsBoolean(this,OptimizeForManyInstancesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnableArrayTypeMutationFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnableArrayTypeMutation");
    pBVar4 = GetAsBoolean(this,EnableArrayTypeMutationFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ArrayMutationTestSeedFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ArrayMutationTestSeed");
    puVar5 = (uint *)GetAsNumber(this,ArrayMutationTestSeedFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TestTraceFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TestTrace");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnableEvalMapCleanupFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnableEvalMapCleanup");
    pBVar4 = GetAsBoolean(this,EnableEvalMapCleanupFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TraceObjectAllocationFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TraceObjectAllocation");
    pBVar4 = GetAsBoolean(this,TraceObjectAllocationFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SseFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"Sse");
    puVar5 = (uint *)GetAsNumber(this,SseFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DeletedPropertyReuseThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DeletedPropertyReuseThreshold");
    puVar5 = (uint *)GetAsNumber(this,DeletedPropertyReuseThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceStringKeyedSimpleDictionaryTypeHandlerFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceStringKeyedSimpleDictionaryTypeHandler");
    pBVar4 = GetAsBoolean(this,ForceStringKeyedSimpleDictionaryTypeHandlerFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BigDictionaryTypeHandlerThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BigDictionaryTypeHandlerThreshold");
    puVar5 = (uint *)GetAsNumber(this,BigDictionaryTypeHandlerThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,TypeSnapshotEnumerationFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"TypeSnapshotEnumeration");
    pBVar4 = GetAsBoolean(this,TypeSnapshotEnumerationFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,IsolatePrototypesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"IsolatePrototypes");
    pBVar4 = GetAsBoolean(this,IsolatePrototypesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ChangeTypeOnProtoFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ChangeTypeOnProto");
    pBVar4 = GetAsBoolean(this,ChangeTypeOnProtoFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ShareInlineCachesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ShareInlineCaches");
    pBVar4 = GetAsBoolean(this,ShareInlineCachesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DisableDebugObjectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DisableDebugObject");
    pBVar4 = GetAsBoolean(this,DisableDebugObjectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,DumpHeapFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"DumpHeap");
    pBVar4 = GetAsBoolean(this,DumpHeapFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,autoProxyFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"autoProxy");
    pSVar2 = GetAsString(this,autoProxyFlag);
    if (pSVar2 != (String *)0x0) {
      pSVar2 = GetAsString(this,autoProxyFlag);
      pcVar3 = String::operator_cast_to_char16_t_(pSVar2);
      Output::Print(L":%s",pcVar3);
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PerfHintLevelFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"PerfHintLevel");
    puVar5 = (uint *)GetAsNumber(this,PerfHintLevelFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MemProtectHeapStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MemProtectHeapStress");
    pBVar4 = GetAsBoolean(this,MemProtectHeapStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MemProtectHeapBackgroundStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MemProtectHeapBackgroundStress");
    pBVar4 = GetAsBoolean(this,MemProtectHeapBackgroundStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MemProtectHeapConcurrentStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MemProtectHeapConcurrentStress");
    pBVar4 = GetAsBoolean(this,MemProtectHeapConcurrentStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MemProtectHeapConcurrentRepeatStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MemProtectHeapConcurrentRepeatStress");
    pBVar4 = GetAsBoolean(this,MemProtectHeapConcurrentRepeatStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MemProtectHeapPartialStressFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MemProtectHeapPartialStress");
    pBVar4 = GetAsBoolean(this,MemProtectHeapPartialStressFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,FixPropsOnPathTypesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"FixPropsOnPathTypes");
    pBVar4 = GetAsBoolean(this,FixPropsOnPathTypesFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BailoutTraceFilterFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BailoutTraceFilter");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,RejitTraceFilterFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"RejitTraceFilter");
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxBackgroundFinishMarkCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxBackgroundFinishMarkCount");
    puVar5 = (uint *)GetAsNumber(this,MaxBackgroundFinishMarkCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,BackgroundFinishMarkWaitTimeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"BackgroundFinishMarkWaitTime");
    puVar5 = (uint *)GetAsNumber(this,BackgroundFinishMarkWaitTimeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MinBackgroundRepeatMarkRescanBytesFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MinBackgroundRepeatMarkRescanBytes");
    puVar5 = (uint *)GetAsNumber(this,MinBackgroundRepeatMarkRescanBytesFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ZeroMemoryWithNonTemporalStoreFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ZeroMemoryWithNonTemporalStore");
    pBVar4 = GetAsBoolean(this,ZeroMemoryWithNonTemporalStoreFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxMarkStackPageCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxMarkStackPageCount");
    puVar5 = (uint *)GetAsNumber(this,MaxMarkStackPageCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxTrackedObjectListCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxTrackedObjectListCount");
    puVar5 = (uint *)GetAsNumber(this,MaxTrackedObjectListCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,NumberAllocPlusSizeFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"NumberAllocPlusSize");
    puVar5 = (uint *)GetAsNumber(this,NumberAllocPlusSizeFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InitializeInterpreterSlotsWithInvalidStackVarFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InitializeInterpreterSlotsWithInvalidStackVar");
    pBVar4 = GetAsBoolean(this,InitializeInterpreterSlotsWithInvalidStackVarFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PRNGSeed0Flag);
  if (bVar1) {
    Output::Print(L"-%s",L"PRNGSeed0");
    puVar5 = (uint *)GetAsNumber(this,PRNGSeed0Flag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,PRNGSeed1Flag);
  if (bVar1) {
    Output::Print(L"-%s",L"PRNGSeed1");
    puVar5 = (uint *)GetAsNumber(this,PRNGSeed1Flag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ClearInlineCachesOnCollectFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ClearInlineCachesOnCollect");
    pBVar4 = GetAsBoolean(this,ClearInlineCachesOnCollectFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,InlineCacheInvalidationListCompactionThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"InlineCacheInvalidationListCompactionThreshold");
    puVar5 = (uint *)GetAsNumber(this,InlineCacheInvalidationListCompactionThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ConstructorCacheInvalidationThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ConstructorCacheInvalidationThreshold");
    puVar5 = (uint *)GetAsNumber(this,ConstructorCacheInvalidationThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,GCMemoryThresholdFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"GCMemoryThreshold");
    puVar5 = (uint *)GetAsNumber(this,GCMemoryThresholdFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,SimulatePolyCacheWithOneTypeForInlineCacheIndexFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"SimulatePolyCacheWithOneTypeForInlineCacheIndex");
    puVar5 = (uint *)GetAsNumber(this,SimulatePolyCacheWithOneTypeForInlineCacheIndexFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,JITServerIdleTimeoutFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"JITServerIdleTimeout");
    puVar5 = (uint *)GetAsNumber(this,JITServerIdleTimeoutFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,JITServerMaxInactivePageAllocatorCountFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"JITServerMaxInactivePageAllocatorCount");
    puVar5 = (uint *)GetAsNumber(this,JITServerMaxInactivePageAllocatorCountFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,StrictWriteBarrierCheckFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"StrictWriteBarrierCheck");
    pBVar4 = GetAsBoolean(this,StrictWriteBarrierCheckFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,WriteBarrierTestFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"WriteBarrierTest");
    pBVar4 = GetAsBoolean(this,WriteBarrierTestFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,ForceSoftwareWriteBarrierFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"ForceSoftwareWriteBarrier");
    pBVar4 = GetAsBoolean(this,ForceSoftwareWriteBarrierFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,VerifyBarrierBitFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"VerifyBarrierBit");
    pBVar4 = GetAsBoolean(this,VerifyBarrierBitFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,EnableBGFreeZeroFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"EnableBGFreeZero");
    pBVar4 = GetAsBoolean(this,EnableBGFreeZeroFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,KeepRecyclerTrackDataFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"KeepRecyclerTrackData");
    pBVar4 = GetAsBoolean(this,KeepRecyclerTrackDataFlag);
    if ((*pBVar4 & 1U) == 0) {
      Output::Print(L"-");
    }
    Output::Print(L"\n");
  }
  bVar1 = IsEnabled(this,MaxSingleAllocSizeInMBFlag);
  if (bVar1) {
    Output::Print(L"-%s",L"MaxSingleAllocSizeInMB");
    puVar5 = (uint *)GetAsNumber(this,MaxSingleAllocSizeInMBFlag);
    Output::Print(L":%d",(ulong)*puVar5);
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void
    ConfigFlagsTable::VerboseDump()
    {
#define FLAG(type, name, ...) \
        if (IsEnabled(name##Flag)) \
        { \
            Output::Print(_u("-%s"), _u(#name)); \
            switch (Flag##type) \
            { \
            case FlagBoolean: \
                if (!*GetAsBoolean(name##Flag)) \
                { \
                    Output::Print(_u("-")); \
                } \
                break; \
            case FlagString: \
                if (GetAsString(name##Flag) != nullptr) \
                { \
                    Output::Print(_u(":%s"), (LPCWSTR)*GetAsString(name##Flag)); \
                } \
                break; \
            case FlagNumber: \
                Output::Print(_u(":%d"), *GetAsNumber(name##Flag)); \
                break; \
            default: \
                break; \
            }; \
            Output::Print(_u("\n")); \
        }

#include "ConfigFlagsList.h"
#undef FLAG
    }